

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O0

EC_T_DWORD
CreateLinkParmsFromCmdLineRTL8169
          (EC_T_CHAR **ptcWord,EC_T_CHAR **lpCmdLine,EC_T_CHAR *tcStorage,EC_T_BOOL *pbGetNextWord,
          EC_T_LINK_PARMS **ppLinkParms)

{
  int iVar1;
  EC_T_BOOL EVar2;
  EC_T_LINK_PARMS *local_40;
  EC_T_LINK_PARMS_RTL8169 *pLinkParmsAdapter;
  EC_T_DWORD dwRetVal;
  EC_T_LINK_PARMS **ppLinkParms_local;
  EC_T_BOOL *pbGetNextWord_local;
  EC_T_CHAR *tcStorage_local;
  EC_T_CHAR **lpCmdLine_local;
  EC_T_CHAR **ptcWord_local;
  
  local_40 = (EC_T_LINK_PARMS *)0x0;
  iVar1 = strcasecmp(*ptcWord,"-rtl8169");
  if (iVar1 == 0) {
    local_40 = (EC_T_LINK_PARMS *)malloc(0x48);
    if (local_40 == (EC_T_LINK_PARMS *)0x0) {
      pLinkParmsAdapter._4_4_ = 0x9811000a;
    }
    else {
      memset(local_40,0,0x48);
      LinkParmsInit(local_40,0xba12ca52,0x48,"RTL8169",1,EcLinkMode_POLLING,0);
      EVar2 = ParseDword(ptcWord,lpCmdLine,tcStorage,&local_40->dwInstance);
      if ((EVar2 == 0) ||
         (EVar2 = ParseLinkMode(ptcWord,lpCmdLine,tcStorage,&local_40->eLinkMode), EVar2 == 0)) {
        pLinkParmsAdapter._4_4_ = 0x9811000b;
      }
      else {
        local_40[1].dwSignature = 0;
        *ppLinkParms = local_40;
        pLinkParmsAdapter._4_4_ = 0;
      }
    }
  }
  else {
    pLinkParmsAdapter._4_4_ = 0x9811000c;
  }
  if ((pLinkParmsAdapter._4_4_ != 0) && (local_40 != (EC_T_LINK_PARMS *)0x0)) {
    free(local_40);
  }
  return pLinkParmsAdapter._4_4_;
}

Assistant:

static EC_T_DWORD CreateLinkParmsFromCmdLineRTL8169(EC_T_CHAR** ptcWord, EC_T_CHAR** lpCmdLine, EC_T_CHAR* tcStorage, EC_T_BOOL*  pbGetNextWord,
                                                    EC_T_LINK_PARMS** ppLinkParms)
{
EC_T_DWORD dwRetVal = EC_E_ERROR;
EC_T_LINK_PARMS_RTL8169* pLinkParmsAdapter = EC_NULL;

    EC_UNREFPARM(pbGetNextWord);

    /* check for matching adapter */
    if (OsStricmp((*ptcWord), "-rtl8169") != 0)
    {
        dwRetVal = EC_E_NOTFOUND;
        goto Exit;
    }
    /* alloc adapter specific link parms */
    pLinkParmsAdapter = (EC_T_LINK_PARMS_RTL8169*)OsMalloc(sizeof(EC_T_LINK_PARMS_RTL8169));
    if (EC_NULL == pLinkParmsAdapter)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    OsMemset(pLinkParmsAdapter, 0, sizeof(EC_T_LINK_PARMS_RTL8169));
    LinkParmsInit(&pLinkParmsAdapter->linkParms, EC_LINK_PARMS_SIGNATURE_RTL8169, sizeof(EC_T_LINK_PARMS_RTL8169), EC_LINK_PARMS_IDENT_RTL8169, 1, EcLinkMode_POLLING);

    if (!ParseDword(ptcWord, lpCmdLine, tcStorage, &pLinkParmsAdapter->linkParms.dwInstance)
       || !ParseLinkMode(ptcWord, lpCmdLine, tcStorage, &pLinkParmsAdapter->linkParms.eLinkMode))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    pLinkParmsAdapter->bNotUseDmaBuffers = EC_FALSE;
#if (defined _ARM_) || (defined __arm__)
    /* for arm platform we should not use DMA memory because any unaligned access creates crash */
    pLinkParmsAdapter->bNotUseDmaBuffers = EC_TRUE;
#endif

    /* no errors */
    *ppLinkParms = &pLinkParmsAdapter->linkParms;
    dwRetVal = EC_E_NOERROR;

Exit:
    if (EC_E_NOERROR != dwRetVal)
    {
        SafeOsFree(pLinkParmsAdapter);
    }
    return dwRetVal;
}